

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O3

size_t __thiscall Name::EncodedSize(Name *this)

{
  ulong uVar1;
  long lVar2;
  
  uVar1 = (this->rdnSequence).super_DerBase.cbData;
  lVar2 = 2;
  if ((((0x7f < uVar1) && (lVar2 = 3, 0xff < uVar1)) && (lVar2 = 4, 0xffff < uVar1)) &&
     (((lVar2 = 5, 0xffffff < uVar1 && (lVar2 = 6, uVar1 >> 0x20 != 0)) &&
      (lVar2 = 7, uVar1 >> 0x28 != 0)))) {
    lVar2 = (ulong)(uVar1 >> 0x30 == 0) << 3;
  }
  return lVar2 + uVar1;
}

Assistant:

virtual size_t EncodedSize() const override
    {
        return rdnSequence.EncodedSize();
    }